

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjson.h
# Opt level: O2

bool __thiscall pjson::value_variant::convert_to_bool(value_variant *this,bool *val,bool def)

{
  json_value_type_t jVar1;
  char *pcVar2;
  int iVar3;
  bool bVar4;
  char *__s1;
  double dVar5;
  
  jVar1 = (this->super_value_variant_data).m_type;
  if (jVar1 - cJSONValueTypeBool < 2) {
    def = (this->super_value_variant_data).m_data.m_object.m_p != (key_value_t *)0x0;
  }
  else {
    if (jVar1 != cJSONValueTypeDouble) {
      if (jVar1 == cJSONValueTypeString) {
        pcVar2 = (this->super_value_variant_data).m_data.m_string.m_p;
        __s1 = "";
        if (pcVar2 != (char *)0x0) {
          __s1 = pcVar2;
        }
        iVar3 = strcasecmp(__s1,"false");
        if (iVar3 == 0) {
          bVar4 = true;
          def = false;
        }
        else {
          iVar3 = strcasecmp(__s1,"true");
          bVar4 = true;
          if (iVar3 == 0) {
            def = true;
          }
          else {
            dVar5 = atof(__s1);
            def = (bool)(-(dVar5 != 0.0) & 1);
          }
        }
      }
      else {
        bVar4 = false;
      }
      goto LAB_00105dbf;
    }
    def = (bool)(-((this->super_value_variant_data).m_data.m_flVal != 0.0) & 1);
  }
  bVar4 = true;
LAB_00105dbf:
  *val = def;
  return bVar4;
}

Assistant:

inline bool convert_to_bool(bool& val, bool def) const
      {
         switch (m_type)
         {
            case cJSONValueTypeBool:
            case cJSONValueTypeInt:
            {
               val = (m_data.m_nVal != 0);
               return true;
            }
            case cJSONValueTypeDouble:
            {
               val = (m_data.m_flVal != 0);
               return true;
            }
            case cJSONValueTypeString:
            {
               if (!pjson_stricmp(get_string_ptr(), "false"))
               {
                  val = false;
                  return true;
               }
               else if (!pjson_stricmp(get_string_ptr(), "true"))
               {
                  val = true;
                  return true;
               }
               val = (atof(get_string_ptr()) != 0.0f);
               return true;
            }
            default:
               break;
         }
         val = def;
         return false;
      }